

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_widget_position(nk_context *ctx)

{
  long lVar1;
  nk_rect *in_RDI;
  nk_rect bounds;
  float local_20;
  float local_1c;
  nk_context *in_stack_ffffffffffffffe8;
  nk_vec2 local_8;
  
  if ((in_RDI == (nk_rect *)0x0) ||
     (lVar1._0_4_ = in_RDI[0x40d].w, lVar1._4_4_ = in_RDI[0x40d].h, lVar1 == 0)) {
    local_8 = nk_vec2(0.0,0.0);
  }
  else {
    nk_layout_peek(in_RDI,in_stack_ffffffffffffffe8);
    local_8 = nk_vec2(local_20,local_1c);
  }
  return local_8;
}

Assistant:

NK_API struct nk_vec2
nk_widget_position(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_vec2(0,0);

nk_layout_peek(&bounds, ctx);
return nk_vec2(bounds.x, bounds.y);
}